

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<float,float,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<float,float>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  float fVar1;
  pointer pfVar2;
  pointer pfVar3;
  Variable<float> *pVVar4;
  pointer pcVar5;
  ostringstream oVar6;
  PrecisionCase *pPVar7;
  FloatFormat *this_00;
  bool bVar8;
  bool bVar9;
  ContextType type;
  int iVar10;
  undefined8 uVar11;
  char *pcVar12;
  size_t sVar13;
  long *plVar14;
  ShaderExecutor *pSVar15;
  IVal *pIVar16;
  TestError *this_01;
  uint uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  ulong uVar19;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_>
  *pVVar20;
  IVal IVar21;
  double dVar22;
  double dVar23;
  IVal reference1;
  FuncSet funcs;
  IVal in3;
  IVal in2;
  ostringstream os;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_> outputs;
  ostringstream oss;
  ShaderSpec spec;
  FloatFormat highpFmt;
  PrecisionCase *local_508;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_>
  *local_500;
  string local_4f8;
  undefined1 local_4d8 [8];
  undefined8 local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  _Rb_tree_node_base *local_4b8;
  size_t local_4b0;
  long local_4a8;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4a0;
  Statement *local_498;
  ulong local_490;
  IVal local_488;
  IVal local_468;
  ulong local_450;
  FloatFormat *local_448;
  ResultCollector *local_440;
  undefined1 local_438 [8];
  double dStack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  double local_418;
  Data local_410;
  undefined4 local_400;
  ios_base local_3c8 [8];
  ios_base local_3c0 [272];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2b0;
  ulong local_280;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248 [3];
  ios_base local_1d8 [264];
  undefined1 local_d0 [56];
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  FloatFormat local_58;
  
  pfVar2 = (inputs->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar3 = (inputs->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar19 = (long)pfVar3 - (long)pfVar2 >> 2;
  local_4a0 = inputs;
  local_498 = stmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_>::Outputs(&local_278,uVar19);
  local_98._M_p = (pointer)&local_88;
  local_d0._0_4_ = GLSL_VERSION_300_ES;
  local_d0._8_8_ = (pointer)0x0;
  local_d0._16_8_ = (pointer)0x0;
  local_d0._24_8_ = (pointer)0x0;
  local_d0._32_8_ = (pointer)0x0;
  local_d0._40_8_ = (pointer)0x0;
  local_d0._48_8_ = (pointer)0x0;
  local_90 = 0;
  local_88._M_local_buf[0] = '\0';
  local_78._M_p = (pointer)&local_68;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_58.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_58.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_58.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_58.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_58.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_58.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_58.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_58.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_58._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2b0._M_impl.super__Rb_tree_header._M_header;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_438 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_508 = this;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2b0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"Statement: ",0xb);
  (*local_498->_vptr_Statement[2])(local_498,(ostringstream *)&dStack_430);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_500 = variables;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
  std::ios_base::~ios_base(local_3c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
  local_4d0 = (double)((ulong)local_4d0._4_4_ << 0x20);
  local_4c8._M_allocated_capacity = 0;
  local_4b0 = 0;
  local_4c8._8_8_ = (_Rb_tree_node_base *)&local_4d0;
  local_4b8 = (_Rb_tree_node_base *)&local_4d0;
  (*local_498->_vptr_Statement[4])(local_498,local_4d8);
  if ((_Rb_tree_node_base *)local_4c8._8_8_ != (_Rb_tree_node_base *)&local_4d0) {
    uVar11 = local_4c8._8_8_;
    do {
      (**(code **)(**(long **)(uVar11 + 0x20) + 0x30))(*(long **)(uVar11 + 0x20),local_248);
      uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11);
    } while ((_Rb_tree_node_base *)uVar11 != (_Rb_tree_node_base *)&local_4d0);
  }
  pVVar20 = local_500;
  if (local_4b0 != 0) {
    local_438 = (undefined1  [8])((local_508->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_430,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_430,
               (char *)CONCAT71(local_4f8._M_dataplus._M_p._1_7_,local_4f8._M_dataplus._M_p._0_1_),
               local_4f8._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_4f8._M_dataplus._M_p._1_7_,local_4f8._M_dataplus._M_p._0_1_) !=
        &local_4f8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_4f8._M_dataplus._M_p._1_7_,local_4f8._M_dataplus._M_p._0_1_),
                      local_4f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
    std::ios_base::~ios_base(local_3c0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_4d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
  std::ios_base::~ios_base(local_1d8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"precision ",10);
  pcVar12 = glu::getPrecisionName((local_508->m_ctx).precision);
  if (pcVar12 == (char *)0x0) {
    std::ios::clear((int)((long)&local_508 + *(long *)((long)local_438 + -0x18)) + 0xd0);
  }
  else {
    sVar13 = strlen(pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,pcVar12,sVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_98,(string *)local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248[0]._M_dataplus._M_p != &local_248[0].field_2) {
    operator_delete(local_248[0]._M_dataplus._M_p,local_248[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_508->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_d0._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_508->m_extension)._M_string_length != 0) {
    std::operator+(local_248,"#extension ",&local_508->m_extension);
    plVar14 = (long *)std::__cxx11::string::append((char *)local_248);
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar18) {
      local_428._M_allocated_capacity = paVar18->_M_allocated_capacity;
      local_428._8_8_ = plVar14[3];
      local_438 = (undefined1  [8])&local_428;
    }
    else {
      local_428._M_allocated_capacity = paVar18->_M_allocated_capacity;
      local_438 = (undefined1  [8])*plVar14;
    }
    dStack_430 = (double)plVar14[1];
    *plVar14 = (long)paVar18;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_98,(string *)local_438);
    if (local_438 != (undefined1  [8])&local_428) {
      operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
    }
    pVVar20 = local_500;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248[0]._M_dataplus._M_p != &local_248[0].field_2) {
      operator_delete(local_248[0]._M_dataplus._M_p,local_248[0].field_2._M_allocated_capacity + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_d0 + 8),2);
  makeSymbol<float>((Symbol *)local_438,local_508,
                    (pVVar20->in1).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar11 = local_d0._8_8_;
  std::__cxx11::string::operator=((string *)(local_d0._8_8_ + 0x38),(string *)local_438);
  glu::VarType::operator=(&((pointer)(uVar11 + 0x38))->varType,(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])&local_428) {
    operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
  }
  makeSymbol<float>((Symbol *)local_438,local_508,
                    (pVVar20->in0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar11 = local_d0._8_8_;
  std::__cxx11::string::operator=((string *)local_d0._8_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])&local_428) {
    operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_d0 + 0x20),2);
  makeSymbol<float>((Symbol *)local_438,local_508,
                    (pVVar20->out1).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar11 = local_d0._32_8_;
  std::__cxx11::string::operator=((string *)(local_d0._32_8_ + 0x38),(string *)local_438);
  glu::VarType::operator=(&((pointer)(uVar11 + 0x38))->varType,(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])&local_428) {
    operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
  }
  makeSymbol<float>((Symbol *)local_438,local_508,
                    (pVVar20->out0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar11 = local_d0._32_8_;
  std::__cxx11::string::operator=((string *)local_d0._32_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])&local_428) {
    operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  (*local_498->_vptr_Statement[2])(local_498,local_438);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  std::__cxx11::string::operator=((string *)&local_78,(string *)local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248[0]._M_dataplus._M_p != &local_248[0].field_2) {
    operator_delete(local_248[0]._M_dataplus._M_p,local_248[0].field_2._M_allocated_capacity + 1);
  }
  pPVar7 = local_508;
  pSVar15 = ShaderExecUtil::createExecutor
                      ((local_508->m_ctx).renderContext,(local_508->m_ctx).shaderType,
                       (ShaderSpec *)local_d0);
  local_438 = (undefined1  [8])
              (local_4a0->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  dStack_430 = (double)(local_4a0->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
  local_428._M_allocated_capacity =
       (size_type)
       (local_4a0->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_428._8_8_ =
       (local_4a0->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_248[0]._M_dataplus._M_p =
       (pointer)local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_248[0]._M_string_length =
       (size_type)
       local_278.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar15->_vptr_ShaderExecutor[3])
            (pSVar15,((pPVar7->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar10 = (*pSVar15->_vptr_ShaderExecutor[2])(pSVar15);
  if ((char)iVar10 != '\0') {
    (*pSVar15->_vptr_ShaderExecutor[5])(pSVar15);
    (*pSVar15->_vptr_ShaderExecutor[6])(pSVar15,uVar19 & 0xffffffff,local_438,local_248);
    (*pSVar15->_vptr_ShaderExecutor[1])(pSVar15);
    local_438 = (undefined1  [8])((ulong)local_438 & 0xffffffffffffff00);
    dStack_430 = INFINITY;
    local_428._M_allocated_capacity = 0xfff0000000000000;
    local_248[0]._M_dataplus._M_p = local_248[0]._M_dataplus._M_p & 0xffffffffffffff00;
    local_248[0]._M_string_length = 0x7ff0000000000000;
    local_248[0].field_2._M_allocated_capacity = -INFINITY;
    local_4d8[0] = false;
    local_4d0 = INFINITY;
    local_4c8._M_allocated_capacity = 0xfff0000000000000;
    local_4f8._M_dataplus._M_p._0_1_ = 0;
    local_4f8._M_string_length = 0x7ff0000000000000;
    local_4f8.field_2._M_allocated_capacity = 0xfff0000000000000;
    Environment::bind<float>
              ((Environment *)&local_2b0,
               (pVVar20->in0).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
               (IVal *)local_438);
    Environment::bind<float>
              ((Environment *)&local_2b0,
               (pVVar20->in1).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
               (IVal *)local_248);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_2b0,
               (pVVar20->in2).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,(IVal *)&local_468);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_2b0,
               (pVVar20->in3).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,(IVal *)&local_488);
    Environment::bind<float>
              ((Environment *)&local_2b0,
               (pVVar20->out0).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
               (IVal *)local_4d8);
    Environment::bind<float>
              ((Environment *)&local_2b0,
               (pVVar20->out1).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
               (IVal *)&local_4f8);
    local_450 = uVar19;
    if (pfVar3 == pfVar2) {
      local_490 = 0;
    }
    else {
      local_448 = &(local_508->m_ctx).floatFormat;
      local_440 = &local_508->m_status;
      local_280 = uVar19 + (uVar19 == 0);
      local_4a8 = 0;
      uVar19 = 0;
      local_490 = 0;
      do {
        this_00 = local_448;
        local_468._0_8_ = local_468._0_8_ & 0xffffffffffffff00;
        local_468.m_lo = INFINITY;
        local_468.m_hi = -INFINITY;
        local_488._0_8_ = local_488._0_8_ & 0xffffffffffffff00;
        local_488.m_lo = INFINITY;
        local_488.m_hi = -INFINITY;
        if ((uVar19 & 0xfff) == 0) {
          tcu::TestContext::touchWatchdog((local_508->super_TestCase).super_TestNode.m_testCtx);
        }
        fVar1 = (local_4a0->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19];
        dVar23 = (double)fVar1;
        oVar6 = (ostringstream)NAN(fVar1);
        dStack_430 = INFINITY;
        if (!(bool)oVar6) {
          dStack_430 = dVar23;
        }
        local_428._M_allocated_capacity = (size_type)-INFINITY;
        if (!(bool)oVar6) {
          local_428._M_allocated_capacity = (size_type)dVar23;
        }
        local_438[0] = oVar6;
        tcu::FloatFormat::roundOut((Interval *)local_4d8,this_00,(Interval *)local_438,false);
        tcu::FloatFormat::convert((Interval *)local_248,this_00,(Interval *)local_4d8);
        pIVar16 = Environment::lookup<float>
                            ((Environment *)&local_2b0,
                             (local_500->in0).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                             .m_ptr);
        pIVar16->m_hi = (double)local_248[0].field_2._0_8_;
        *(pointer *)pIVar16 = local_248[0]._M_dataplus._M_p;
        pIVar16->m_lo = (double)local_248[0]._M_string_length;
        fVar1 = (local_4a0->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19];
        dVar23 = (double)fVar1;
        local_438[0] = (ostringstream)NAN(fVar1);
        dStack_430 = INFINITY;
        if (!(bool)local_438[0]) {
          dStack_430 = dVar23;
        }
        local_428._M_allocated_capacity = (size_type)-INFINITY;
        if (!(bool)local_438[0]) {
          local_428._M_allocated_capacity = (size_type)dVar23;
        }
        tcu::FloatFormat::roundOut((Interval *)local_4d8,this_00,(Interval *)local_438,false);
        tcu::FloatFormat::convert((Interval *)local_248,this_00,(Interval *)local_4d8);
        pIVar16 = Environment::lookup<float>
                            ((Environment *)&local_2b0,
                             (local_500->in1).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                             .m_ptr);
        pVVar20 = local_500;
        pIVar16->m_hi = (double)local_248[0].field_2._0_8_;
        *(pointer *)pIVar16 = local_248[0]._M_dataplus._M_p;
        pIVar16->m_lo = (double)local_248[0]._M_string_length;
        Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                  ((Environment *)&local_2b0,
                   (local_500->in2).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                   .m_ptr);
        Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                  ((Environment *)&local_2b0,
                   (pVVar20->in3).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                   .m_ptr);
        local_410.basic.type = (local_508->m_ctx).precision;
        local_418 = local_448->m_maxValue;
        local_438 = *(undefined1 (*) [8])local_448;
        dStack_430 = *(double *)&local_448->m_fractionBits;
        local_428._M_allocated_capacity = *(undefined8 *)&local_448->m_hasInf;
        local_428._8_8_ = *(undefined8 *)&local_448->m_exactPrecision;
        local_400 = 0;
        local_410._8_8_ = &local_2b0;
        (*local_498->_vptr_Statement[3])(local_498,(MessageBuilder *)local_438);
        pIVar16 = Environment::lookup<float>
                            ((Environment *)&local_2b0,
                             (local_500->out1).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                             .m_ptr);
        tcu::FloatFormat::convert((Interval *)local_438,&local_58,pIVar16);
        local_488.m_hi = (double)local_428._M_allocated_capacity;
        local_488._0_8_ = local_438;
        uVar11 = local_488._0_8_;
        local_488.m_lo = dStack_430;
        fVar1 = local_278.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19];
        dVar22 = (double)fVar1;
        dVar23 = dVar22;
        if (NAN(fVar1)) {
          dVar23 = INFINITY;
          dVar22 = -INFINITY;
        }
        IVar21 = (IVal)(dVar22 <= (double)local_428._M_allocated_capacity && dStack_430 <= dVar23);
        if ((NAN(fVar1)) &&
           (dVar22 <= (double)local_428._M_allocated_capacity && dStack_430 <= dVar23)) {
          local_488.m_hasNaN = local_438[0];
          IVar21 = (IVal)local_488.m_hasNaN;
        }
        local_438 = (undefined1  [8])&local_428;
        local_488._0_8_ = uVar11;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,"Shader output 1 is outside acceptable range","");
        bVar8 = tcu::ResultCollector::check(local_440,(bool)((byte)IVar21 & 1),(string *)local_438);
        if (local_438 != (undefined1  [8])&local_428) {
          operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
        }
        pIVar16 = Environment::lookup<float>
                            ((Environment *)&local_2b0,
                             (local_500->out0).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                             .m_ptr);
        tcu::FloatFormat::convert((Interval *)local_438,&local_58,pIVar16);
        local_468.m_hi = (double)local_428._M_allocated_capacity;
        local_468._0_8_ = local_438;
        uVar11 = local_468._0_8_;
        local_468.m_lo = dStack_430;
        fVar1 = local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19];
        dVar22 = (double)fVar1;
        dVar23 = dVar22;
        if (NAN(fVar1)) {
          dVar23 = INFINITY;
          dVar22 = -INFINITY;
        }
        IVar21 = (IVal)(dVar22 <= (double)local_428._M_allocated_capacity && dStack_430 <= dVar23);
        if ((NAN(fVar1)) &&
           (dVar22 <= (double)local_428._M_allocated_capacity && dStack_430 <= dVar23)) {
          local_468.m_hasNaN = local_438[0];
          IVar21 = (IVal)local_468.m_hasNaN;
        }
        local_438 = (undefined1  [8])&local_428;
        local_468._0_8_ = uVar11;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,"Shader output 0 is outside acceptable range","");
        bVar9 = tcu::ResultCollector::check(local_440,(bool)((byte)IVar21 & 1),(string *)local_438);
        if (local_438 != (undefined1  [8])&local_428) {
          operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
        }
        uVar17 = (int)local_490 + ((byte)~(bVar8 && bVar9) & 1);
        local_490 = (ulong)uVar17;
        if ((int)uVar17 < 0x65 && (!bVar8 || !bVar9)) {
          local_438 = (undefined1  [8])((local_508->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
          pcVar12 = "Failed";
          if (bVar8 && bVar9) {
            pcVar12 = "Passed";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,pcVar12,6);
          paVar18 = &local_248[0].field_2;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\t",1);
          pVVar4 = (local_500->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          local_248[0]._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,local_248[0]._M_dataplus._M_p,
                     local_248[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," = ",3);
          valueToString<float>
                    ((string *)local_4d8,&local_58,
                     (float *)((long)(local_4a0->in0).
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + local_4a8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)CONCAT71(local_4d8._1_7_,local_4d8[0]),
                     (long)local_4d0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_4d8._1_7_,local_4d8[0]) != &local_4c8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_4d8._1_7_,local_4d8[0]),
                            (ulong)(local_4c8._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248[0]._M_dataplus._M_p != paVar18) {
            operator_delete(local_248[0]._M_dataplus._M_p,
                            local_248[0].field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\t",1);
          pVVar4 = (local_500->in1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          local_248[0]._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,local_248[0]._M_dataplus._M_p,
                     local_248[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," = ",3);
          valueToString<float>
                    ((string *)local_4d8,&local_58,
                     (float *)((long)(local_4a0->in1).
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + local_4a8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)CONCAT71(local_4d8._1_7_,local_4d8[0]),
                     (long)local_4d0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_4d8._1_7_,local_4d8[0]) != &local_4c8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_4d8._1_7_,local_4d8[0]),
                            (ulong)(local_4c8._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248[0]._M_dataplus._M_p != paVar18) {
            operator_delete(local_248[0]._M_dataplus._M_p,
                            local_248[0].field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\t",1);
          pVVar4 = (local_500->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          local_248[0]._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,local_248[0]._M_dataplus._M_p,
                     local_248[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," = ",3);
          valueToString<float>
                    ((string *)local_4d8,&local_58,
                     (float *)((long)local_278.out0.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + local_4a8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)CONCAT71(local_4d8._1_7_,local_4d8[0]),
                     (long)local_4d0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,"\tExpected range: ",0x11);
          intervalToString<float>(&local_4f8,&local_58,&local_468);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,
                     (char *)CONCAT71(local_4f8._M_dataplus._M_p._1_7_,
                                      local_4f8._M_dataplus._M_p._0_1_),local_4f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_4f8._M_dataplus._M_p._1_7_,local_4f8._M_dataplus._M_p._0_1_) !=
              &local_4f8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_4f8._M_dataplus._M_p._1_7_,
                                     local_4f8._M_dataplus._M_p._0_1_),
                            local_4f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_4d8._1_7_,local_4d8[0]) != &local_4c8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_4d8._1_7_,local_4d8[0]),
                            (ulong)(local_4c8._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248[0]._M_dataplus._M_p != paVar18) {
            operator_delete(local_248[0]._M_dataplus._M_p,
                            local_248[0].field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\t",1);
          pVVar4 = (local_500->out1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          local_248[0]._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,local_248[0]._M_dataplus._M_p,
                     local_248[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," = ",3);
          valueToString<float>
                    ((string *)local_4d8,&local_58,
                     (float *)((long)local_278.out1.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + local_4a8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)CONCAT71(local_4d8._1_7_,local_4d8[0]),
                     (long)local_4d0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,"\tExpected range: ",0x11);
          intervalToString<float>(&local_4f8,&local_58,&local_488);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,
                     (char *)CONCAT71(local_4f8._M_dataplus._M_p._1_7_,
                                      local_4f8._M_dataplus._M_p._0_1_),local_4f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_4f8._M_dataplus._M_p._1_7_,local_4f8._M_dataplus._M_p._0_1_) !=
              &local_4f8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_4f8._M_dataplus._M_p._1_7_,
                                     local_4f8._M_dataplus._M_p._0_1_),
                            local_4f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_4d8._1_7_,local_4d8[0]) != &local_4c8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_4d8._1_7_,local_4d8[0]),
                            (ulong)(local_4c8._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248[0]._M_dataplus._M_p != paVar18) {
            operator_delete(local_248[0]._M_dataplus._M_p,
                            local_248[0].field_2._M_allocated_capacity + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
          std::ios_base::~ios_base(local_3c0);
        }
        uVar19 = uVar19 + 1;
        local_4a8 = local_4a8 + 4;
      } while (local_280 != uVar19);
    }
    iVar10 = (int)local_490;
    if (100 < iVar10) {
      local_438 = (undefined1  [8])((local_508->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&dStack_430,iVar10 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
      std::ios_base::~ios_base(local_3c0);
    }
    if (iVar10 == 0) {
      local_438 = (undefined1  [8])((local_508->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"All ",4);
      std::ostream::_M_insert<unsigned_long>((ulong)&dStack_430);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&dStack_430," inputs passed.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_438 = (undefined1  [8])((local_508->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
      std::ostream::operator<<((ostringstream *)&dStack_430,iVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"/",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&dStack_430);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&dStack_430," inputs failed.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
    std::ios_base::~ios_base(local_3c0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
    ::~_Rb_tree(&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,
                      CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,
                      CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]) + 1);
    }
    std::
    vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>::
    ~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_d0 + 0x20));
    std::
    vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>::
    ~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_d0 + 8));
    if (local_278.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_278.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_278.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_278.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    if (local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    return;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Shader compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
             ,0x11d4);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}